

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

ARKodeMem arkCreate(SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeMem arkode_mem;
  ARKodeHAdaptMem pAVar2;
  SUNAdaptController p_Var3;
  int iVar4;
  char *pcVar5;
  long leniw;
  long lenrw;
  ARKodeMem local_38;
  long local_30;
  long local_28;
  
  if (sunctx == (SUNContext_conflict)0x0) {
    pcVar5 = "sunctx = NULL illegal.";
    iVar4 = -0x16;
    iVar1 = 0x55c;
  }
  else {
    arkode_mem = (ARKodeMem)calloc(1,0x3e0);
    if (arkode_mem != (ARKodeMem)0x0) {
      arkode_mem->sunctx = sunctx;
      arkode_mem->uround = 2.220446049250313e-16;
      arkode_mem->lrw = 0x12;
      arkode_mem->liw = 0x35;
      local_38 = arkode_mem;
      pAVar2 = arkAdaptInit();
      arkode_mem->hadapt_mem = pAVar2;
      if (pAVar2 == (ARKodeHAdaptMem)0x0) {
        pcVar5 = "Allocation of step adaptivity structure failed";
        iVar4 = -0x14;
        iVar1 = 0x5c8;
      }
      else {
        arkode_mem->lrw = arkode_mem->lrw + 10;
        arkode_mem->liw = arkode_mem->liw + 7;
        p_Var3 = SUNAdaptController_PID(sunctx);
        pAVar2 = arkode_mem->hadapt_mem;
        pAVar2->hcontroller = p_Var3;
        if (p_Var3 == (SUNAdaptController)0x0) {
          pcVar5 = "Allocation of step controller object failed";
          iVar4 = -0x14;
          iVar1 = 0x5d4;
        }
        else {
          pAVar2->owncontroller = 1;
          SUNAdaptController_Space(p_Var3,&local_28,&local_30);
          arkode_mem->lrw = arkode_mem->lrw + local_28;
          arkode_mem->liw = arkode_mem->liw + local_30;
          arkode_mem->interp = (ARKInterp)0x0;
          arkode_mem->interp_type = 0;
          arkode_mem->interp_degree = 5;
          arkode_mem->rwt_is_ewt = 1;
          arkode_mem->call_fullrhs = 0;
          arkode_mem->initsetup = 1;
          arkode_mem->init_type = 0;
          arkode_mem->firststage = 1;
          arkode_mem->initialized = 0;
          arkode_mem->h = 0.0;
          arkode_mem->h0u = 0.0;
          iVar1 = ARKodeSetDefaults(arkode_mem);
          if (iVar1 == 0) {
            return arkode_mem;
          }
          pcVar5 = "Error setting default solver options";
          iVar4 = 0;
          iVar1 = 0x5fa;
        }
      }
      arkProcessError((ARKodeMem)0x0,iVar4,iVar1,"arkCreate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,pcVar5);
      ARKodeFree(&local_38);
      return (ARKodeMem)0x0;
    }
    pcVar5 = "Allocation of arkode_mem failed.";
    iVar4 = -0x14;
    iVar1 = 0x565;
    local_38 = (ARKodeMem)0x0;
  }
  arkProcessError((ARKodeMem)0x0,iVar4,iVar1,"arkCreate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,pcVar5);
  return (ARKodeMem)0x0;
}

Assistant:

ARKodeMem arkCreate(SUNContext sunctx)
{
  int iret;
  long int lenrw, leniw;
  ARKodeMem ark_mem;

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  ark_mem = NULL;
  ark_mem = (ARKodeMem)malloc(sizeof(struct ARKodeMemRec));
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }

  /* Zero out ark_mem */
  memset(ark_mem, 0, sizeof(struct ARKodeMemRec));

  /* Set the context */
  ark_mem->sunctx = sunctx;

  /* Set uround */
  ark_mem->uround = SUN_UNIT_ROUNDOFF;

  /* Initialize time step module to NULL */
  ark_mem->step_attachlinsol              = NULL;
  ark_mem->step_attachmasssol             = NULL;
  ark_mem->step_disablelsetup             = NULL;
  ark_mem->step_disablemsetup             = NULL;
  ark_mem->step_getlinmem                 = NULL;
  ark_mem->step_getmassmem                = NULL;
  ark_mem->step_getimplicitrhs            = NULL;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = NULL;
  ark_mem->step_init                      = NULL;
  ark_mem->step_fullrhs                   = NULL;
  ark_mem->step                           = NULL;
  ark_mem->step_setuserdata               = NULL;
  ark_mem->step_printallstats             = NULL;
  ark_mem->step_writeparameters           = NULL;
  ark_mem->step_resize                    = NULL;
  ark_mem->step_reset                     = NULL;
  ark_mem->step_free                      = NULL;
  ark_mem->step_printmem                  = NULL;
  ark_mem->step_setdefaults               = NULL;
  ark_mem->step_computestate              = NULL;
  ark_mem->step_setrelaxfn                = NULL;
  ark_mem->step_setorder                  = NULL;
  ark_mem->step_setnonlinearsolver        = NULL;
  ark_mem->step_setlinear                 = NULL;
  ark_mem->step_setnonlinear              = NULL;
  ark_mem->step_setautonomous             = NULL;
  ark_mem->step_setnlsrhsfn               = NULL;
  ark_mem->step_setdeduceimplicitrhs      = NULL;
  ark_mem->step_setnonlincrdown           = NULL;
  ark_mem->step_setnonlinrdiv             = NULL;
  ark_mem->step_setdeltagammamax          = NULL;
  ark_mem->step_setlsetupfrequency        = NULL;
  ark_mem->step_setpredictormethod        = NULL;
  ark_mem->step_setmaxnonliniters         = NULL;
  ark_mem->step_setnonlinconvcoef         = NULL;
  ark_mem->step_setstagepredictfn         = NULL;
  ark_mem->step_getnumlinsolvsetups       = NULL;
  ark_mem->step_getestlocalerrors         = NULL;
  ark_mem->step_getcurrentgamma           = NULL;
  ark_mem->step_getnonlinearsystemdata    = NULL;
  ark_mem->step_getnumnonlinsolviters     = NULL;
  ark_mem->step_getnumnonlinsolvconvfails = NULL;
  ark_mem->step_getnonlinsolvstats        = NULL;
  ark_mem->step_mem                       = NULL;
  ark_mem->step_supports_adaptive         = SUNFALSE;
  ark_mem->step_supports_implicit         = SUNFALSE;
  ark_mem->step_supports_massmatrix       = SUNFALSE;
  ark_mem->step_supports_relaxation       = SUNFALSE;

  /* Initialize root finding variables */
  ark_mem->root_mem = NULL;

  /* Initialize inequality constraints variables */
  ark_mem->constraintsSet = SUNFALSE;
  ark_mem->constraints    = NULL;

  /* Initialize relaxation variables */
  ark_mem->relax_enabled = SUNFALSE;
  ark_mem->relax_mem     = NULL;

  /* Initialize lrw and liw */
  ark_mem->lrw = 18;
  ark_mem->liw = 53; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */

  /* No mallocs have been done yet */
  ark_mem->VabstolMallocDone  = SUNFALSE;
  ark_mem->VRabstolMallocDone = SUNFALSE;
  ark_mem->MallocDone         = SUNFALSE;

  /* No user-supplied step postprocessing function yet */
  ark_mem->ProcessStep = NULL;
  ark_mem->ps_data     = NULL;

  /* No user-supplied stage postprocessing function yet */
  ark_mem->ProcessStage = NULL;

  /* No user_data pointer yet */
  ark_mem->user_data = NULL;

  /* Allocate step adaptivity structure and note storage */
  ark_mem->hadapt_mem = arkAdaptInit();
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Allocation of step adaptivity structure failed");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  ark_mem->lrw += ARK_ADAPT_LRW;
  ark_mem->liw += ARK_ADAPT_LIW;

  /* Allocate default step controller (PID) and note storage */
  ark_mem->hadapt_mem->hcontroller = SUNAdaptController_PID(sunctx);
  if (ark_mem->hadapt_mem->hcontroller == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Allocation of step controller object failed");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  ark_mem->hadapt_mem->owncontroller = SUNTRUE;
  (void)SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                 &leniw);
  ark_mem->lrw += lenrw;
  ark_mem->liw += leniw;

  /* Initialize the interpolation structure to NULL */
  ark_mem->interp        = NULL;
  ark_mem->interp_type   = ARK_INTERP_HERMITE;
  ark_mem->interp_degree = ARK_INTERP_MAX_DEGREE;

  /* Initially, rwt should point to ewt */
  ark_mem->rwt_is_ewt = SUNTRUE;

  /* Indicate that calling the full RHS function is not required, this flag is
     updated to SUNTRUE by the interpolation module initialization function
     and/or the stepper initialization function in arkInitialSetup */
  ark_mem->call_fullrhs = SUNFALSE;

  /* Indicate that the problem needs to be initialized */
  ark_mem->initsetup   = SUNTRUE;
  ark_mem->init_type   = FIRST_INIT;
  ark_mem->firststage  = SUNTRUE;
  ark_mem->initialized = SUNFALSE;

  /* Initial step size has not been determined yet */
  ark_mem->h   = ZERO;
  ark_mem->h0u = ZERO;

  /* Set default values for integrator optional inputs */
  iret = ARKodeSetDefaults(ark_mem);
  if (iret != ARK_SUCCESS)
  {
    arkProcessError(NULL, 0, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Return pointer to ARKODE memory block */
  return (ark_mem);
}